

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPFakeTransmitter::Create
          (RTPFakeTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  int iVar1;
  
  iVar1 = -0x84;
  if (this->init == true) {
    if (this->created == false) {
      if (transparams == (RTPTransmissionParams *)0x0) {
        transparams = (RTPTransmissionParams *)
                      operator_new(0x60,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
        RTPFakeTransmissionParams::RTPFakeTransmissionParams
                  ((RTPFakeTransmissionParams *)transparams);
      }
      else if (transparams->protocol != UserDefinedProto) {
        return -0x7d;
      }
      this->params = (RTPFakeTransmissionParams *)transparams;
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->localIPs,&((RTPFakeTransmissionParams *)transparams)->localIPs);
      if ((this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          _M_node.super__List_node_base._M_next == (_List_node_base *)&this->localIPs) {
        CreateLocalIPList(this);
      }
      this->supportsmulticasting = false;
      iVar1 = -0x86;
      if (maximumpacketsize < 0x10000) {
        this->maxpacksize = maximumpacketsize;
        this->portbase = *(uint16_t *)&(this->params->super_RTPTransmissionParams).field_0xc;
        this->multicastTTL = this->params->multicastTTL;
        *(undefined4 *)((long)&this->localhostnamelength + 4) = 0;
        *(undefined8 *)&this->receivemode = 0;
        *(undefined8 *)((long)&this->localhostname + 4) = 0;
        this->created = true;
        this->waitingfordata = false;
        iVar1 = 0;
      }
    }
    else {
      iVar1 = -0x78;
    }
  }
  return iVar1;
}

Assistant:

int RTPFakeTransmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
//	struct sockaddr_in addr;
//	int status;

	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) RTPFakeTransmissionParams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::UserDefinedProto)
			return ERR_RTP_FAKETRANS_ILLEGALPARAMETERS;
		params = (RTPFakeTransmissionParams *)transparams;
	}

	// Check if portbase is even
	//if (params->GetPortbase()%2 != 0)
	//{
	//	MAINMUTEX_UNLOCK
	//	return ERR_RTP_FAKETRANS_PORTBASENOTEVEN;
	//}

	// Try to obtain local IP addresses

	localIPs = params->GetLocalIPList();
	if (localIPs.empty()) // User did not provide list of local IP addresses, calculate them
	{
		int status;
		
		if ((status = CreateLocalIPList()) < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
#ifdef RTPDEBUG
		std::cout << "Found these local IP addresses:" << std::endl;
		
		std::list<uint32_t>::const_iterator it;

		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			RTPIPv4Address a(*it);

			std::cout << a.GetAddressString() << std::endl;
		}
#endif // RTPDEBUG
	}

//#ifdef RTP_SUPPORT_IPV4MULTICAST
//	if (SetMulticastTTL(params->GetMulticastTTL()))
//		supportsmulticasting = true;
//	else
//		supportsmulticasting = false;
//#else // no multicast support enabled
	supportsmulticasting = false;
//#endif // RTP_SUPPORT_IPV4MULTICAST

	if (maximumpacketsize > RTPFAKETRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}
	
	maxpacksize = maximumpacketsize;
	portbase = params->GetPortbase();
	multicastTTL = params->GetMulticastTTL();
	receivemode = RTPTransmitter::AcceptAll;

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;

	MAINMUTEX_UNLOCK
	return 0;
}